

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::computeViewLevel(CppGenerator *this,size_t group_id,TDNode *node)

{
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *this_00;
  _WordT *p_Var1;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pvVar5;
  size_t *psVar6;
  Aggregate *pAVar7;
  ulong *puVar8;
  size_t *psVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar18;
  pointer pbVar19;
  size_t sVar20;
  View *pVVar21;
  pointer ppAVar22;
  pointer pbVar23;
  Function *pFVar24;
  pointer pbVar25;
  Function *pFVar26;
  size_t sVar27;
  size_t var;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  size_t f2;
  ulong uVar32;
  ulong uVar33;
  ulong *puVar34;
  size_t *psVar35;
  size_t f;
  ulong __position;
  long lVar36;
  size_t *incViewID;
  size_t *psVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  var_bitset coveredVariableOrder;
  prod_bitset overlapFunc;
  undefined1 local_248 [16];
  undefined1 local_218 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1b8 [12] [16];
  ulong local_f0 [24];
  
  pvVar18 = this->groupVariableOrder + group_id;
  this_00 = &this->coveredVariables;
  pbVar19 = (this->coveredVariables).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->coveredVariables).
      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar19) {
    (this->coveredVariables).
    super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar19;
  }
  pbVar19 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (this_00,(long)(pvVar18->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar18->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar3 = (this->addableViews).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->addableViews).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    memset(puVar3,0,(long)puVar4 - (long)puVar3 & 0xfffffffffffffff8);
  }
  puVar3 = (pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar20 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->addableViews,(sVar20 + 1) * ((long)puVar3 - (long)puVar4 >> 3),false);
  pvVar5 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar35 = pvVar5[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar6 = *(pointer *)
            ((long)&pvVar5[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  do {
    if (psVar35 == psVar6) {
      return;
    }
    pVVar21 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,*psVar35);
    if ((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0] == 0) {
      bVar17 = true;
      do {
        bVar16 = bVar17;
        if (!bVar16) break;
        bVar17 = false;
      } while ((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1] == 0);
      if (bVar16) {
        bVar17 = false;
      }
      else {
        this->viewLevelRegister[*psVar35] =
             (long)(pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
        bVar17 = true;
      }
    }
    else {
      bVar17 = false;
    }
    local_1f8 = *(undefined1 (*) [16])(pVVar21->_fVars).super__Base_bitset<2UL>._M_w;
    pbVar25 = (this->variableDependency).
              super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_218 = (undefined1  [16])0x0;
    uVar28 = 0;
    do {
      if (((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)
      {
        local_218._8_8_ = local_218._8_8_ | (pbVar25->super__Base_bitset<2UL>)._M_w[1];
        local_218._0_8_ = local_218._0_8_ | (pbVar25->super__Base_bitset<2UL>)._M_w[0];
      }
      uVar28 = uVar28 + 1;
      pbVar25 = pbVar25 + 1;
    } while (uVar28 != 100);
    auVar39._8_4_ = 0xffffffff;
    auVar39._0_8_ = 0xffffffffffffffff;
    auVar39._12_4_ = 0xffffffff;
    auVar40 = *(undefined1 (*) [16])(pbVar19->super__Base_bitset<2UL>)._M_w ^ auVar39;
    auVar41._0_8_ = auVar40._0_8_;
    auVar41._8_8_ = auVar40._8_8_ & 0xfffffffff;
    auVar39 = *(undefined1 (*) [16])(node->_bag).super__Base_bitset<2UL>._M_w ^ auVar39;
    auVar40._0_8_ = auVar39._0_8_;
    auVar40._8_8_ = auVar39._8_8_ & 0xfffffffff;
    auVar40 = auVar40 & *(undefined1 (*) [16])(pVVar21->_fVars).super__Base_bitset<2UL>._M_w &
                        auVar41;
    if (auVar40._0_8_ == 0) {
      bVar16 = true;
      do {
        bVar15 = bVar16;
        if (!bVar15) break;
        bVar16 = false;
      } while (auVar40._8_8_ == 0);
      if (bVar15) goto LAB_00241025;
    }
    else {
LAB_00241025:
      ppAVar22 = (pVVar21->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((pVVar21->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppAVar22) {
        uVar28 = 0;
        do {
          pAVar7 = ppAVar22[uVar28];
          pbVar23 = (pAVar7->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pAVar7->_agg).
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
              .super__Vector_impl_data._M_finish != pbVar23) {
            uVar33 = 0;
            do {
              memset(local_1b8,0,0xc0);
              __position = 0;
              do {
                bVar16 = std::bitset<1500UL>::test(pbVar23 + uVar33,__position);
                if ((bVar16) &&
                   ((*(ulong *)(local_1b8[0] + (__position >> 6) * 8) >> (__position & 0x3f) & 1) ==
                    0)) {
                  pFVar24 = QueryCompiler::getFunction
                                      ((this->_qc).
                                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,__position);
                  auVar39 = *(undefined1 (*) [16])(pFVar24->_fVars).super__Base_bitset<2UL>._M_w &
                            auVar41 & local_218;
                  if (auVar39._0_8_ == 0) {
                    bVar16 = true;
                    do {
                      bVar15 = bVar16;
                      if (!bVar15) break;
                      bVar16 = false;
                    } while (auVar39._8_8_ == 0);
                    if (!bVar15) goto LAB_002412a9;
                  }
                  pbVar25 = (this->variableDependency).
                            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_248 = (undefined1  [16])0x0;
                  uVar29 = 0;
                  do {
                    if (((pFVar24->_fVars).super__Base_bitset<2UL>._M_w[uVar29 >> 6] >>
                         (uVar29 & 0x3f) & 1) != 0) {
                      local_248 = local_248 |
                                  *(undefined1 (*) [16])(pbVar25->super__Base_bitset<2UL>)._M_w;
                    }
                    uVar29 = uVar29 + 1;
                    pbVar25 = pbVar25 + 1;
                  } while (uVar29 != 100);
                  uVar29 = (pbVar19->super__Base_bitset<2UL>)._M_w[0];
                  uVar11 = (pbVar19->super__Base_bitset<2UL>)._M_w[1];
                  auVar39 = *(undefined1 (*) [16])(pFVar24->_fVars).super__Base_bitset<2UL>._M_w;
                  memset(local_f0,0,0xc0);
                  local_f0[__position >> 6] =
                       local_f0[__position >> 6] | 1L << ((byte)__position & 0x3f);
                  do {
                    auVar39 = auVar39 | *(undefined1 (*) [16])
                                         (pFVar24->_fVars).super__Base_bitset<2UL>._M_w;
                    uVar32 = 0;
                    bVar16 = false;
                    do {
                      uVar38 = uVar32 >> 6;
                      uVar31 = 1L << ((byte)uVar32 & 0x3f);
                      if ((((pbVar23[uVar33].super__Base_bitset<24UL>._M_w[uVar38] >>
                             (uVar32 & 0x3f) & 1) != 0) &&
                          ((*(ulong *)(local_1b8[0] + uVar38 * 8) & uVar31) == 0)) &&
                         ((local_f0[uVar38] & uVar31) == 0)) {
                        pFVar26 = QueryCompiler::getFunction
                                            ((this->_qc).
                                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr,__position);
                        if (((pFVar26->_fVars).super__Base_bitset<2UL>._M_w[0] &
                            local_248._0_8_ & (uVar29 ^ 0xffffffffffffffff)) == 0) {
                          bVar15 = true;
                          do {
                            bVar12 = bVar15;
                            if (!bVar12) break;
                            bVar15 = false;
                          } while (((pFVar26->_fVars).super__Base_bitset<2UL>._M_w[1] &
                                   local_248._8_8_ & (uVar11 ^ 0xffffffffffffffff) & 0xfffffffff) ==
                                   0);
                          if (!bVar12) goto LAB_0024126f;
                        }
                        *(ulong *)(local_1b8[0] + uVar38 * 8) =
                             *(ulong *)(local_1b8[0] + uVar38 * 8) | uVar31;
                        local_f0[uVar38] = local_f0[uVar38] | uVar31;
                        auVar39 = auVar39 | *(undefined1 (*) [16])
                                             (pFVar26->_fVars).super__Base_bitset<2UL>._M_w;
                        bVar16 = true;
                      }
LAB_0024126f:
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != 0x5dc);
                  } while (bVar16);
                  local_1f8 = local_1f8 | auVar39;
                }
LAB_002412a9:
                __position = __position + 1;
              } while (__position != 0x5dc);
              uVar33 = uVar33 + 1;
              pbVar23 = (pAVar7->_agg).
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)(((long)(pAVar7->_agg).
                                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar23 >> 6) * -0x5555555555555555));
          }
          uVar28 = uVar28 + 1;
          ppAVar22 = (pVVar21->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar28 < (ulong)((long)(pVVar21->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar22
                                 >> 3));
      }
    }
    local_1b8[0] = (undefined1  [16])0x0;
    puVar34 = (pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar8 = (pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar34 != puVar8) {
      lVar36 = 0;
      sVar20 = 0;
      do {
        uVar28 = *puVar34;
        if (99 < uVar28) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar28,100)
          ;
        }
        uVar33 = 1L << ((byte)uVar28 & 0x3f);
        *(ulong *)(local_1b8[0] + (uVar28 >> 6) * 8) =
             *(ulong *)(local_1b8[0] + (uVar28 >> 6) * 8) | uVar33;
        pbVar25 = (this_00->
                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var1 = pbVar25[sVar20].super__Base_bitset<2UL>._M_w + (uVar28 >> 6);
        *p_Var1 = *p_Var1 | uVar33;
        uVar28 = (pbVar19->super__Base_bitset<2UL>)._M_w[0] &
                 (node->_bag).super__Base_bitset<2UL>._M_w[0];
        uVar33 = (pbVar19->super__Base_bitset<2UL>)._M_w[1] &
                 (node->_bag).super__Base_bitset<2UL>._M_w[1];
        uVar13 = local_1b8[0]._0_8_;
        uVar14 = local_1b8[0]._8_8_;
        if ((local_1b8[0]._0_8_ & uVar28) == uVar28) {
          bVar16 = false;
          do {
            bVar15 = bVar16;
            if (bVar15) break;
            bVar16 = true;
          } while ((local_1b8[0]._8_8_ & uVar33) == uVar33);
          if (bVar15) {
            lVar30 = 0;
            do {
              puVar2 = (ulong *)((long)(pbVar25->super__Base_bitset<2UL>)._M_w + lVar30 * 8 + lVar36
                                );
              *puVar2 = *puVar2 | (node->_bag).super__Base_bitset<2UL>._M_w[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 == 1);
          }
        }
        psVar9 = this->incomingViews[*psVar35].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (psVar37 = this->incomingViews[*psVar35].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar37 != psVar9; psVar37 = psVar37 + 1) {
          pVVar21 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar37);
          uVar28 = (pbVar19->super__Base_bitset<2UL>)._M_w[0] &
                   (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0];
          uVar33 = (pbVar19->super__Base_bitset<2UL>)._M_w[1] &
                   (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1];
          if ((uVar28 & uVar13) == uVar28) {
            bVar16 = false;
            do {
              bVar15 = bVar16;
              if (bVar15) break;
              bVar16 = true;
            } while ((uVar33 & uVar14) == uVar33);
            if (bVar15) {
              sVar10 = *psVar37;
              sVar27 = QueryCompiler::numberOfViews
                                 ((this->_qc).
                                  super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
              uVar28 = (sVar27 + 1) * sVar20 + sVar10;
              puVar2 = (this->addableViews).m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + (uVar28 >> 6);
              *puVar2 = *puVar2 | 1L << ((byte)uVar28 & 0x3f);
              pbVar25 = (this->coveredVariables).
                        super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar30 = 0;
              do {
                puVar2 = (ulong *)((long)(pbVar25->super__Base_bitset<2UL>)._M_w +
                                  lVar30 * 8 + lVar36);
                *puVar2 = *puVar2 | (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 == 1);
            }
          }
        }
        if ((!bVar17) &&
           (pbVar25 = (this_00->
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                      _M_impl.super__Vector_impl_data._M_start + sVar20,
           ((pbVar25->super__Base_bitset<2UL>)._M_w[0] & local_1f8._0_8_) == local_1f8._0_8_)) {
          bVar16 = false;
          do {
            bVar15 = bVar16;
            if (bVar15) break;
            bVar16 = true;
          } while (((pbVar25->super__Base_bitset<2UL>)._M_w[1] & local_1f8._8_8_) == local_1f8._8_8_
                  );
          if (bVar15) {
            this->viewLevelRegister[*psVar35] = sVar20;
            bVar17 = true;
          }
        }
        sVar20 = sVar20 + 1;
        puVar34 = puVar34 + 1;
        lVar36 = lVar36 + 0x10;
      } while (puVar34 != puVar8);
    }
    psVar35 = psVar35 + 1;
  } while( true );
}

Assistant:

void CppGenerator::computeViewLevel(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];

    coveredVariables.clear();
    coveredVariables.resize(varOrder.size());
    
    addableViews.reset();
    addableViews.resize(varOrder.size() * (_qc->numberOfViews()+1));

    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);
        bool setViewLevel = false;
        
        // if this view has no free variables it should be outputted before the join 
        if (view->_fVars.none())
        {
            viewLevelRegister[viewID] = varOrder.size();
            setViewLevel = true;
        }
        
        var_bitset varsToCover = view->_fVars;

        var_bitset dependentViewVars;
        for (size_t var=0; var<NUM_OF_VARIABLES;++var)
        {
            if (view->_fVars[var])
                dependentViewVars |= variableDependency[var];
        }
        dependentViewVars &= ~varOrderBitset;

        // TODO: (consider) should we check for overlap for bag vars that are
        // not in varOrder?
        var_bitset nonJoinVars = view->_fVars & ~varOrderBitset & ~node._bag;
        
        if (nonJoinVars.any())
        {
            //  if this is the case then look for overlapping functions
            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                Aggregate* aggregate = view->_aggregates[aggNo];

                for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                {
                    const prod_bitset& product = aggregate->_agg[i];
                    prod_bitset considered;
                        
                    for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                    {
                        if (product.test(f) && !considered[f])
                        {
                            Function* function = _qc->getFunction(f);
                                
                            // check if this function is covered
                            if ((function->_fVars & dependentViewVars).any())
                            {
                                var_bitset dependentFunctionVars;
                                for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                                {
                                    if (function->_fVars[var])
                                        dependentFunctionVars |= variableDependency[var];
                                }
                                dependentFunctionVars &= ~varOrderBitset;

                                // if it is - find functions that overlap
                                bool overlaps;
                                var_bitset overlapVars = function->_fVars;
                                prod_bitset overlapFunc;
                                overlapFunc.set(f);

                                do
                                {
                                    overlaps = false;
                                    overlapVars |= function->_fVars;

                                    for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                                    {
                                        if (product[f2] && !considered[f2] && !overlapFunc[f2])
                                        {
                                            Function* otherFunction = _qc->getFunction(f);
                                            // check if functions overlap
                                            if ((otherFunction->_fVars & dependentFunctionVars).any())
                                            {
                                                considered.set(f2);
                                                overlapFunc.set(f2);
                                                overlaps = true;
                                                overlapVars |= otherFunction->_fVars;
                                            }
                                        }
                                    }
                                } while(overlaps);

                                varsToCover |= overlapVars;
                            }
                        }
                    }                        
                }    
            }
        }
        
        // check when the freeVars of the view are covered - this determines
        // when we need to add the declaration of aggregate array and push to
        // view vector !
        size_t depth = 0;
        var_bitset coveredVariableOrder;
 
        for (const size_t& var : varOrder)
        {
            coveredVariableOrder.set(var);
            coveredVariables[depth].set(var);
            
            var_bitset intersection = node._bag & varOrderBitset;
            if ((intersection & coveredVariableOrder) == intersection) 
                coveredVariables[depth] |= node._bag;

            for (const size_t& incViewID : incomingViews[viewID]) 
            {
                // check if view is covered !
                View* incView = _qc->getView(incViewID);
                
                var_bitset viewJoinVars = incView->_fVars & varOrderBitset;
                if ((viewJoinVars & coveredVariableOrder) == viewJoinVars) 
                {
                    addableViews.set(incViewID + (depth * (_qc->numberOfViews()+1)));
                    coveredVariables[depth] |= incView->_fVars;
                }
            }

            if (!setViewLevel && (varsToCover & coveredVariables[depth]) == varsToCover)
            {
                // this is the depth where we add the declaration of aggregate
                // array and push to the vector !
                viewLevelRegister[viewID] = depth;
                setViewLevel = true;
            }
            ++depth;
        }
    }
}